

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::GetTests
          (cmMakefile *this,string *config,vector<cmTest_*,_std::allocator<cmTest_*>_> *tests)

{
  pointer ppcVar1;
  cmTestGenerator *this_00;
  bool bVar2;
  cmTest *in_RAX;
  pointer ppcVar3;
  cmTest *local_38;
  
  ppcVar1 = (this->TestGenerators).
            super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  for (ppcVar3 = (this->TestGenerators).
                 super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
    this_00 = *ppcVar3;
    bVar2 = cmTestGenerator::TestsForConfig(this_00,config);
    if (bVar2) {
      local_38 = cmTestGenerator::GetTest(this_00);
      std::vector<cmTest*,std::allocator<cmTest*>>::emplace_back<cmTest*>
                ((vector<cmTest*,std::allocator<cmTest*>> *)tests,&local_38);
    }
  }
  return;
}

Assistant:

void cmMakefile::GetTests(const std::string& config,
                          std::vector<cmTest*>& tests)
{
  for (auto generator : this->GetTestGenerators()) {
    if (generator->TestsForConfig(config)) {
      tests.push_back(generator->GetTest());
    }
  }
}